

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O0

FTexture * PatchTexture_TryCreate(FileReader *file,int lumpnum)

{
  bool bVar1;
  FileReader *pFVar2;
  patch_t local_24;
  patch_t header;
  int lumpnum_local;
  FileReader *file_local;
  
  header._0_4_ = lumpnum;
  unique0x10000124 = file;
  bVar1 = CheckIfPatch(file);
  if (bVar1) {
    (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[4])
              (stack0xffffffffffffffe8,0);
    pFVar2 = FileReader::operator>>(stack0xffffffffffffffe8,&local_24.width);
    pFVar2 = FileReader::operator>>(pFVar2,&local_24.height);
    pFVar2 = FileReader::operator>>(pFVar2,&local_24.leftoffset);
    FileReader::operator>>(pFVar2,&local_24.topoffset);
    file_local = (FileReader *)operator_new(0x70);
    FPatchTexture::FPatchTexture((FPatchTexture *)file_local,header._0_4_,&local_24);
  }
  else {
    file_local = (FileReader *)0x0;
  }
  return (FTexture *)file_local;
}

Assistant:

FTexture *PatchTexture_TryCreate(FileReader & file, int lumpnum)
{
	patch_t header;

	if (!CheckIfPatch(file)) return NULL;
	file.Seek(0, SEEK_SET);
	file >> header.width >> header.height >> header.leftoffset >> header.topoffset;
	return new FPatchTexture(lumpnum, &header);
}